

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_RHINOIO_OBJECT_BREP
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  ON_Interval proxy_curve_subdomain;
  ON_Interval real_curve_subdomain;
  bool bVar1;
  bool bVar2;
  ON_Brep *this_00;
  ON_Curve *pOVar3;
  ON_NurbsSurface *pOVar4;
  ON_BrepVertex *pOVar5;
  ON_BrepEdge *this_01;
  ON_BrepTrim *this_02;
  ON_BrepLoop *pOVar6;
  ON_BrepFace *pOVar7;
  int iVar8;
  int sz;
  bool bHaveMat;
  int j;
  ON__UINT32 tcode;
  int version;
  ON__INT64 big_value;
  ON_Curve *curve;
  double tol3d;
  double tol2d;
  ON_3dPoint m_oldTrim_mP [2];
  uint local_d0;
  bool local_c9;
  ON_3dmObjectAttributes *local_c8;
  TYPE local_c0;
  int local_bc;
  uint local_b8;
  ON__INT32 local_b4;
  ON__INT64 local_b0;
  ON_BoundingBox local_a8;
  double local_78;
  double local_70;
  double local_68 [3];
  double local_50 [4];
  
  local_c9 = false;
  local_b8 = 0;
  local_b0 = 0;
  bVar1 = BeginRead3dmBigChunk(this,&local_b8,&local_b0);
  if (!bVar1) {
    return false;
  }
  if (local_b8 == 0x2fffe) {
    local_b4 = -1;
    bVar1 = ReadInt32(this,1,&local_b4);
    if (!bVar1) goto LAB_003a96ad;
    if (local_b4 - 0x66U < 0xfffffffe) {
      return false;
    }
    this_00 = (ON_Brep *)operator_new(0x138);
    ON_Brep::ON_Brep(this_00);
    bVar1 = ReadInt32(this,1,(ON__INT32 *)&local_d0);
    if ((bVar1) && (0 < (long)(int)local_d0)) {
      local_c8 = pAttributes;
      if (((uint)(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity < local_d0) &&
         (ON_SimpleArray<ON_Curve_*>::SetCapacity
                    (&(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>,(long)(int)local_d0),
         (int)local_d0 < 1)) {
        iVar8 = 0;
      }
      else {
        iVar8 = 0;
        do {
          pOVar3 = ReadV1_RHINOIO_BREP_CURVE(this);
          local_a8.m_min.x._0_4_ = (uint)pOVar3;
          local_a8.m_min.x._4_4_ = (undefined4)((ulong)pOVar3 >> 0x20);
          if (pOVar3 == (ON_Curve *)0x0) break;
          ON_SimpleArray<ON_Curve_*>::Append
                    (&(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_a8);
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)local_d0);
      }
      if (iVar8 < (int)local_d0) {
LAB_003a9724:
        bVar1 = false;
        pAttributes = local_c8;
        goto LAB_003a96b3;
      }
      bVar1 = ReadInt32(this,1,(ON__INT32 *)&local_d0);
      pAttributes = local_c8;
      if ((bVar1) && (0 < (long)(int)local_d0)) {
        if (((uint)(this_00->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_capacity < local_d0) &&
           (ON_SimpleArray<ON_Curve_*>::SetCapacity
                      (&(this_00->m_C3).super_ON_SimpleArray<ON_Curve_*>,(long)(int)local_d0),
           (int)local_d0 < 1)) {
          iVar8 = 0;
        }
        else {
          iVar8 = 0;
          do {
            pOVar3 = ReadV1_RHINOIO_BREP_CURVE(this);
            local_a8.m_min.x._0_4_ = (uint)pOVar3;
            local_a8.m_min.x._4_4_ = (undefined4)((ulong)pOVar3 >> 0x20);
            if (pOVar3 == (ON_Curve *)0x0) break;
            ON_SimpleArray<ON_Curve_*>::Append
                      (&(this_00->m_C3).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_a8);
            iVar8 = iVar8 + 1;
          } while (iVar8 < (int)local_d0);
        }
        if (iVar8 < (int)local_d0) goto LAB_003a9724;
        bVar1 = ReadInt32(this,1,(ON__INT32 *)&local_d0);
        pAttributes = local_c8;
        if ((bVar1) && (0 < (long)(int)local_d0)) {
          if (((uint)(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity < local_d0) &&
             (ON_SimpleArray<ON_Surface_*>::SetCapacity
                        (&(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>,(long)(int)local_d0),
             (int)local_d0 < 1)) {
            iVar8 = 0;
          }
          else {
            iVar8 = 0;
            while( true ) {
              local_b8 = 0;
              local_b0 = 0;
              bVar1 = BeginRead3dmBigChunk(this,&local_b8,&local_b0);
              if (!bVar1) break;
              local_bc = iVar8;
              if (local_b8 != 0x20009) {
                EndRead3dmChunk(this,false);
                iVar8 = local_bc;
                break;
              }
              pOVar4 = ReadV1_RHINOIO_NURBS_SURFACE_OBJECT_DATA(this);
              bVar1 = EndRead3dmChunk(this,false);
              iVar8 = local_bc;
              if ((pOVar4 == (ON_NurbsSurface *)0x0) || (!bVar1)) break;
              local_a8.m_min.x._0_4_ = (uint)pOVar4;
              local_a8.m_min.x._4_4_ = (undefined4)((ulong)pOVar4 >> 0x20);
              ON_SimpleArray<ON_Surface_*>::Append
                        (&(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>,(ON_Surface **)&local_a8
                        );
              iVar8 = local_bc + 1;
              if ((int)local_d0 <= iVar8) break;
            }
          }
          if ((int)local_d0 <= iVar8) {
            ReadInt32(this,1,(ON__INT32 *)&local_d0);
            if ((uint)(this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                      super_ON_ClassArray<ON_BrepVertex>.m_capacity < local_d0) {
              ON_ClassArray<ON_BrepVertex>::SetCapacity
                        ((ON_ClassArray<ON_BrepVertex> *)&this_00->m_V,(long)(int)local_d0);
            }
            iVar8 = 0;
            if (0 < (int)local_d0) {
              while( true ) {
                pOVar5 = ON_Brep::NewVertex(this_00);
                bVar1 = ReadInt32(this,1,&pOVar5->m_vertex_index);
                if (((!bVar1) ||
                    (bVar1 = ReadDouble(this,3,&(pOVar5->super_ON_Point).point.x), !bVar1)) ||
                   (bVar1 = ReadArray(this,&pOVar5->m_ei), !bVar1)) break;
                bVar1 = ReadDouble(this,1,&pOVar5->m_tolerance);
                if ((!bVar1) || (iVar8 = iVar8 + 1, (int)local_d0 <= iVar8)) break;
              }
            }
            if ((int)local_d0 <= iVar8) {
              ReadInt32(this,1,(ON__INT32 *)&local_d0);
              if ((uint)(this_00->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                        super_ON_ClassArray<ON_BrepEdge>.m_capacity < local_d0) {
                ON_ClassArray<ON_BrepEdge>::SetCapacity
                          ((ON_ClassArray<ON_BrepEdge> *)&this_00->m_E,(long)(int)local_d0);
              }
              iVar8 = 0;
              if (0 < (int)local_d0) {
                while( true ) {
                  ON_Interval::ON_Interval((ON_Interval *)&local_a8);
                  this_01 = ON_Brep::NewEdge(this_00,-1);
                  bVar1 = ReadInt32(this,1,&this_01->m_edge_index);
                  if (((!bVar1) || (bVar1 = ReadInt32(this,1,&this_01->m_c3i), !bVar1)) ||
                     (bVar1 = ReadDouble(this,2,(double *)&local_a8), !bVar1)) break;
                  proxy_curve_subdomain.m_t[0]._4_4_ = local_a8.m_min.x._4_4_;
                  proxy_curve_subdomain.m_t[0]._0_4_ = local_a8.m_min.x._0_4_;
                  proxy_curve_subdomain.m_t[1] = local_a8.m_min.y;
                  ON_CurveProxy::SetProxyCurveDomain
                            (&this_01->super_ON_CurveProxy,proxy_curve_subdomain);
                  bVar1 = ReadInt32(this,2,this_01->m_vi);
                  if ((((!bVar1) || (bVar1 = ReadArray(this,&this_01->m_ti), !bVar1)) ||
                      (bVar1 = ReadDouble(this,1,&this_01->m_tolerance), !bVar1)) ||
                     (iVar8 = iVar8 + 1, (int)local_d0 <= iVar8)) break;
                }
              }
              if ((int)local_d0 <= iVar8) {
                ReadInt32(this,1,(ON__INT32 *)&local_d0);
                if ((uint)(this_00->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                          super_ON_ClassArray<ON_BrepTrim>.m_capacity < local_d0) {
                  ON_ClassArray<ON_BrepTrim>::SetCapacity
                            ((ON_ClassArray<ON_BrepTrim> *)&this_00->m_T,(long)(int)local_d0);
                }
                iVar8 = 0;
                if (0 < (int)local_d0) {
                  while( true ) {
                    this_02 = ON_Brep::NewTrim(this_00,-1);
                    bVar1 = ReadInt32(this,1,&this_02->m_trim_index);
                    if ((!bVar1) || (bVar1 = ReadInt32(this,1,&this_02->m_c2i), !bVar1)) break;
                    ON_Interval::ON_Interval((ON_Interval *)&local_a8);
                    bVar1 = ReadDouble(this,2,(double *)&local_a8);
                    if (!bVar1) break;
                    real_curve_subdomain.m_t[0]._4_4_ = local_a8.m_min.x._4_4_;
                    real_curve_subdomain.m_t[0]._0_4_ = local_a8.m_min.x._0_4_;
                    real_curve_subdomain.m_t[1] = local_a8.m_min.y;
                    ON_CurveProxy::SetProxyCurve
                              (&this_02->super_ON_CurveProxy,(ON_Curve *)0x0,real_curve_subdomain);
                    bVar1 = ReadInt32(this,1,&this_02->m_ei);
                    if ((!bVar1) || (bVar1 = ReadInt32(this,2,this_02->m_vi), !bVar1)) break;
                    local_c0 = (TYPE)this_02->m_bRev3d;
                    bVar1 = ReadInt32(this,1,(ON__INT32 *)&local_c0);
                    if (!bVar1) break;
                    this_02->m_bRev3d = local_c0 != unknown;
                    bVar1 = ReadInt32(this,1,(ON__INT32 *)&local_c0);
                    if (!bVar1) break;
                    if (local_c0 - outer < 4) {
                      this_02->m_type = local_c0;
                    }
                    bVar1 = ReadInt32(this,1,(ON__INT32 *)&local_c0);
                    if ((((((!bVar1) || (bVar1 = ReadInt32(this,1,&this_02->m_li), !bVar1)) ||
                          (bVar1 = ReadDouble(this,2,this_02->m_tolerance), !bVar1)) ||
                         ((bVar1 = ReadDouble(this,3,local_68), !bVar1 ||
                          (bVar1 = ReadDouble(this,3,local_50), !bVar1)))) ||
                        (bVar1 = ReadDouble(this,1,&local_70), !bVar1)) ||
                       ((bVar1 = ReadDouble(this,1,&local_78), !bVar1 ||
                        (iVar8 = iVar8 + 1, (int)local_d0 <= iVar8)))) break;
                  }
                }
                if ((int)local_d0 <= iVar8) {
                  ReadInt32(this,1,(ON__INT32 *)&local_d0);
                  if ((uint)(this_00->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                            super_ON_ClassArray<ON_BrepLoop>.m_capacity < local_d0) {
                    ON_ClassArray<ON_BrepLoop>::SetCapacity
                              ((ON_ClassArray<ON_BrepLoop> *)&this_00->m_L,(long)(int)local_d0);
                  }
                  iVar8 = 0;
                  if (0 < (int)local_d0) {
                    while( true ) {
                      pOVar6 = ON_Brep::NewLoop(this_00,unknown);
                      bVar1 = ReadInt32(this,1,&pOVar6->m_loop_index);
                      if (((!bVar1) || (bVar1 = ReadArray(this,&pOVar6->m_ti), !bVar1)) ||
                         (bVar1 = ReadInt32(this,1,(ON__INT32 *)&local_c0), !bVar1)) break;
                      if (local_c0 - outer < 3) {
                        pOVar6->m_type = local_c0;
                      }
                      bVar1 = ReadInt32(this,1,&pOVar6->m_fi);
                      if ((!bVar1) || (iVar8 = iVar8 + 1, (int)local_d0 <= iVar8)) break;
                    }
                  }
                  if ((int)local_d0 <= iVar8) {
                    ReadInt32(this,1,(ON__INT32 *)&local_d0);
                    if ((uint)(this_00->m_F).super_ON_ObjectArray<ON_BrepFace>.
                              super_ON_ClassArray<ON_BrepFace>.m_capacity < local_d0) {
                      ON_ClassArray<ON_BrepFace>::SetCapacity
                                ((ON_ClassArray<ON_BrepFace> *)&this_00->m_F,(long)(int)local_d0);
                    }
                    iVar8 = 0;
                    if (0 < (int)local_d0) {
                      do {
                        pOVar7 = ON_Brep::NewFace(this_00,-1);
                        bVar1 = ReadInt32(this,1,&pOVar7->m_face_index);
                        if (((!bVar1) || (bVar1 = ReadArray(this,&pOVar7->m_li), !bVar1)) ||
                           (bVar1 = ReadInt32(this,1,&pOVar7->m_si), !bVar1)) break;
                        local_a8.m_min.x._0_4_ = (uint)pOVar7->m_bRev;
                        bVar1 = ReadInt32(this,1,(ON__INT32 *)&local_a8);
                        if (!bVar1) break;
                        pOVar7->m_bRev = local_a8.m_min.x._0_4_ != 0;
                        iVar8 = iVar8 + 1;
                      } while (iVar8 < (int)local_d0);
                    }
                    if ((int)local_d0 <= iVar8) {
                      ON_BoundingBox::ON_BoundingBox(&local_a8);
                      bVar1 = ReadDouble(this,3,(double *)&local_a8);
                      if (bVar1) {
                        bVar2 = ReadDouble(this,3,&local_a8.m_max.x);
                        bVar1 = true;
                        pAttributes = local_c8;
                        if (bVar2) goto LAB_003a96b3;
                      }
                    }
                  }
                }
              }
              goto LAB_003a9724;
            }
          }
        }
      }
    }
  }
  else {
LAB_003a96ad:
    this_00 = (ON_Brep *)0x0;
  }
  bVar1 = false;
LAB_003a96b3:
  bVar2 = EndRead3dmChunk(this,false);
  if (((this_00 != (ON_Brep *)0x0) && (bVar1)) && (bVar2)) {
    ON_Brep::SetTrimIsoFlags(this_00);
    *ppObject = (ON_Object *)this_00;
    Read3dmV1AttributesOrMaterial
              (this,pAttributes,(ON_Material *)0x0,&local_c9,0x2ffff,(ON__3dmV1_XDATA *)0x0);
    return true;
  }
  if (this_00 != (ON_Brep *)0x0) {
    (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_RHINOIO_OBJECT_BREP(
  ON_Object** ppObject,
  ON_3dmObjectAttributes* pAttributes
  )
{
  ON_3dPoint m_oldTrim_mP[2];
  bool bHaveMat = false;
  bool rc = false;
  ON_Brep* brep = 0;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  if ( !BeginRead3dmBigChunk( &tcode, &big_value ) )
    return false;
  if ( tcode == TCODE_RHINOIO_OBJECT_DATA ) for (;;) {
    int version = -1;
    int sz, i, j;
    double tol2d, tol3d;
    if ( !ReadInt( &version ) ) 
      break; // serialization version
    // version = 100 means the b-rep was written by the RhinoIO toolkit
    // version = 101 means the b-rep was written by Rhino 1.0
    if ( version != 100 && version != 101 ) {
      return false;
    }

    brep = new ON_Brep();

    // 2d trimming curves
    if ( !ReadInt( &sz ) )
      break;
    if ( sz < 1 ) {
      break;
    }
    brep->m_C2.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_Curve* curve = ReadV1_RHINOIO_BREP_CURVE( *this );
      if ( !curve )
        break;
      brep->m_C2.Append(curve);
    }
    if ( i < sz )
      break;

    // 3d trimming curves
    if ( !ReadInt( &sz ) )
      break;
    if ( sz < 1 ) {
      break;
    }
    brep->m_C3.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_Curve* curve = ReadV1_RHINOIO_BREP_CURVE( *this );
      if ( !curve )
        break;
      brep->m_C3.Append(curve);
    }
    if ( i < sz )
      break;

    // 3d untrimmed surfaces
    if ( !ReadInt( &sz ) )
      break;
    if ( sz < 1 ) {
      break;
    }
    brep->m_S.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_NurbsSurface* surface = 0;
      tcode = 0;
      big_value = 0;
      if ( !BeginRead3dmBigChunk(&tcode,&big_value) )
        break;
      if ( tcode == TCODE_RHINOIO_OBJECT_NURBS_SURFACE ) {
        surface = ReadV1_RHINOIO_NURBS_SURFACE_OBJECT_DATA( *this );
      }
      if ( !EndRead3dmChunk() )
        break;
      if ( !surface )
        break;
      brep->m_S.Append(surface);
    }
    if ( i < sz )
      break;

    // vertices
    ReadInt( &sz );
    brep->m_V.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepVertex& vertex = brep->NewVertex();
      if ( !ReadInt( &vertex.m_vertex_index ) ) break;
      if ( !ReadPoint( vertex.point ) ) break;
      if ( !ReadArray( vertex.m_ei ) ) break;
      if ( !ReadDouble( &vertex.m_tolerance ) ) break;
    }
    if ( i < sz )
      break;

    // edges
    ReadInt( &sz );
    brep->m_E.Reserve(sz);
    for ( i = 0; i < sz; i++ ) 
    {
      ON_Interval proxy_domain;
      ON_BrepEdge& edge = brep->NewEdge();
      if ( !ReadInt( &edge.m_edge_index ) ) break;
      if ( !ReadInt( &edge.m_c3i ) ) break;
      if ( !ReadInterval( proxy_domain ) ) break;
      edge.SetProxyCurveDomain(proxy_domain);
      if ( !ReadInt( 2, edge.m_vi ) ) break;
      if ( !ReadArray( edge.m_ti ) ) break;
      if ( !ReadDouble( &edge.m_tolerance ) ) break;
    }
    if ( i < sz )
      break;

    // trims
    ReadInt( &sz );
    brep->m_T.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepTrim& trim = brep->NewTrim();
      if ( !ReadInt( &trim.m_trim_index ) ) break;
      if ( !ReadInt( &trim.m_c2i ) ) break;
      ON_Interval d;
      if ( !ReadInterval( d ) ) 
        break;
      trim.SetProxyCurve(nullptr,d);
      if ( !ReadInt( &trim.m_ei ) ) break;
      if ( !ReadInt( 2, trim.m_vi ) ) break;
      j = trim.m_bRev3d;
      if ( !ReadInt( &j ) ) break;
      trim.m_bRev3d = (j!=0);
      if ( !ReadInt( &j ) ) break;
      switch(j) {
      case 1: trim.m_type = ON_BrepTrim::boundary; break;
      case 2: trim.m_type = ON_BrepTrim::mated; break;
      case 3: trim.m_type = ON_BrepTrim::seam; break;
      case 4: trim.m_type = ON_BrepTrim::singular; break;
      }
      if ( !ReadInt( &j ) ) break; // legacy iso flag - ignore and recaluate
      if ( !ReadInt( &trim.m_li ) ) break;
      if ( !ReadDouble( 2, trim.m_tolerance ) ) break;
      if ( !ReadPoint( m_oldTrim_mP[0] ) ) break;
      if ( !ReadPoint( m_oldTrim_mP[1] ) ) break;
      if ( !ReadDouble( &tol2d ) ) break;
      if ( !ReadDouble( &tol3d ) ) break;
    }
    if ( i < sz )
      break;

    // loops
    ReadInt( &sz );
    brep->m_L.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepLoop& loop = brep->NewLoop(ON_BrepLoop::unknown);
      if ( !ReadInt( &loop.m_loop_index ) ) break;
      if ( !ReadArray( loop.m_ti ) ) break;
      if ( !ReadInt( &j ) ) break;
      switch (j) {
      case 1: loop.m_type = ON_BrepLoop::outer; break;
      case 2: loop.m_type = ON_BrepLoop::inner; break;
      case 3: loop.m_type = ON_BrepLoop::slit; break;
      }
      if ( !ReadInt( &loop.m_fi ) ) break;
    }
    if ( i < sz )
      break;

    // faces
    ReadInt( &sz );
    brep->m_F.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepFace& face = brep->NewFace();
      if ( !ReadInt( &face.m_face_index ) ) break;
      if ( !ReadArray( face.m_li ) ) break;
      if ( !ReadInt( &face.m_si ) ) break;
      int k = face.m_bRev;
      if ( !ReadInt( &k ) ) break;
      face.m_bRev = (k!=0);
    }
    if ( i < sz )
      break;

    // bounding box
    {
      ON_BoundingBox bbox;
      if ( !ReadPoint( bbox.m_min ) ) break;
      if ( !ReadPoint( bbox.m_max ) ) break;
    }

    rc = true;
    break;
  }
  if ( !EndRead3dmChunk() )
    rc = false;
  if ( rc && brep ) {
    brep->SetTrimIsoFlags();
    *ppObject = brep;
  }
  else {
    if ( brep )
      delete brep;
    rc = false;
  }

  if ( rc && brep ) {
    Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_RHINOIO_OBJECT_END);
  }

  return rc;
}